

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O3

Instr * __thiscall
Inline::InlinePolymorphicFunctionUsingFixedMethods
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *inlinerData,StackSym *symCallerThis,
          ProfileId profileId,PropertySymOpnd *methodValueOpnd,bool *pIsInlined,
          uint recursiveInlineDepth)

{
  OpCode OVar1;
  StackSym *pSVar2;
  _func_int **pp_Var3;
  SymOpnd *this_00;
  Func *pFVar4;
  code *pcVar5;
  bool bVar6;
  OpndKind OVar7;
  ArgSlot AVar8;
  uint16 cachedFixedInlineeCount;
  uint uVar9;
  TypeId TVar10;
  FunctionJITTimeInfo *pFVar11;
  undefined4 *puVar12;
  FunctionJITTimeInfo *pFVar13;
  JITTimeFunctionBody *pJVar14;
  char16 *pcVar15;
  Inline *pIVar16;
  char16 *pcVar17;
  char16 *pcVar18;
  PropertySymOpnd *pPVar19;
  Instr *pIVar20;
  intptr_t iVar21;
  FixedFieldInfo *pFVar22;
  intptr_t iVar23;
  Instr *pIVar24;
  Opnd *pOVar25;
  char16 *pcVar26;
  LabelInstr *pLVar27;
  LabelInstr *instr;
  FunctionJITRuntimeInfo *inlineeRuntimeData;
  JITType *pJVar28;
  AddrOpnd *pAVar29;
  BranchInstr *pBVar30;
  JITTypeHolder JVar31;
  char16_t *form;
  undefined **this_01;
  char *pcVar32;
  undefined6 in_register_00000082;
  int iVar33;
  uint i;
  ulong uVar34;
  RegOpnd *src1Opnd;
  uint i_1;
  uint uVar35;
  wchar local_198 [4];
  char16 debugStringBuffer2 [42];
  wchar local_138 [4];
  char16 debugStringBuffer [42];
  FunctionJITTimeInfo *pFStack_d8;
  FunctionJITTimeInfo *inlineesDataArray [4];
  JITTypeHolderBase<void> local_a8;
  Instr *local_a0;
  RegOpnd *local_98;
  FixedFieldInfo *local_90;
  AddrOpnd *local_88;
  FunctionJITTimeInfo *local_80;
  Instr *local_78;
  PropertySymOpnd *local_70;
  StackSym *local_68;
  uint local_5c;
  RegOpnd *local_58;
  Instr *local_50;
  Inline *local_48;
  LabelInstr *local_40;
  bool local_31 [8];
  bool safeThis;
  
  local_50 = callInstr->m_next;
  *pIsInlined = false;
  local_58 = (RegOpnd *)CONCAT44(local_58._4_4_,(int)CONCAT62(in_register_00000082,profileId));
  local_48 = this;
  local_40 = (LabelInstr *)inlinerData;
  pFVar11 = FunctionJITTimeInfo::GetInlinee(inlinerData,profileId);
  if (pFVar11 == (FunctionJITTimeInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x2d5,"(inlineeJitTimeData)","inlineeJitTimeData");
    if (!bVar6) goto LAB_005412d5;
    *puVar12 = 0;
  }
  pFVar13 = FunctionJITTimeInfo::GetNext(pFVar11);
  if (pFVar13 == (FunctionJITTimeInfo *)0x0) {
    bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,PolymorphicInlinePhase);
    if (!bVar6) goto LAB_005403e4;
    pJVar14 = FunctionJITTimeInfo::GetBody(pFVar11);
    pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar14);
    pcVar17 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar11,(wchar (*) [42])local_138);
    pLVar27 = local_40;
    pJVar14 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)local_40);
    pcVar18 = JITTimeFunctionBody::GetDisplayName(pJVar14);
    pcVar26 = FunctionJITTimeInfo::GetDebugNumberSet
                        ((FunctionJITTimeInfo *)pLVar27,(wchar (*) [42])local_198);
    Output::Print(L"INLINING (Polymorphic): Skip Inline: Missing JitTime data \tInlinee: %s (%s):\tCaller: %s (%s)\n"
                  ,pcVar15,pcVar17,pcVar18,pcVar26);
  }
  else {
    if ((callInstr->m_src2 != (Opnd *)0x0) &&
       (OVar7 = IR::Opnd::GetKind(callInstr->m_src2), OVar7 == OpndKindSym)) {
      pOVar25 = callInstr->m_src2;
      OVar7 = IR::Opnd::GetKind(pOVar25);
      local_78 = callInstr;
      if (OVar7 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar6) goto LAB_005412d5;
        *puVar12 = 0;
      }
      pSVar2 = (StackSym *)pOVar25[1]._vptr_Opnd;
      if ((pSVar2->super_Sym).m_kind != SymKindStack) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar6) goto LAB_005412d5;
        *puVar12 = 0;
      }
      callInstr = local_78;
      AVar8 = StackSym::GetArgSlotNum(pSVar2);
      if (0xf < AVar8) {
        bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,PolymorphicInlinePhase);
        if (!bVar6) goto LAB_005403e4;
        pJVar14 = FunctionJITTimeInfo::GetBody(pFVar11);
        pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar14);
        pIVar16 = (Inline *)
                  FunctionJITTimeInfo::GetDebugNumberSet(pFVar11,(wchar (*) [42])local_138);
        pOVar25 = callInstr->m_src2;
        OVar7 = IR::Opnd::GetKind(pOVar25);
        if (OVar7 != OpndKindSym) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar12 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
          if (!bVar6) goto LAB_005412d5;
          *puVar12 = 0;
        }
        pSVar2 = (StackSym *)pOVar25[1]._vptr_Opnd;
        local_48 = pIVar16;
        if ((pSVar2->super_Sym).m_kind != SymKindStack) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar12 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                             ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
          if (!bVar6) goto LAB_005412d5;
          *puVar12 = 0;
        }
        AVar8 = StackSym::GetArgSlotNum(pSVar2);
        pLVar27 = local_40;
        pJVar14 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)local_40);
        pcVar17 = JITTimeFunctionBody::GetDisplayName(pJVar14);
        pcVar18 = FunctionJITTimeInfo::GetDebugNumberSet
                            ((FunctionJITTimeInfo *)pLVar27,(wchar (*) [42])local_198);
        Output::Print(L"INLINING (Polymorphic): Skip Inline: ArgSlot > MaxInlineeArgoutCount\tInlinee: %s (%s)\tArgSlotNum: %d\tMaxInlineeArgoutCount: %d\tCaller: %s (%s)\n"
                      ,pcVar15,local_48,(ulong)AVar8,0xf,pcVar17,pcVar18);
        goto LAB_005403df;
      }
    }
    iVar33 = 0;
    pFVar13 = pFVar11;
    do {
      pFVar13 = FunctionJITTimeInfo::GetNext(pFVar13);
      iVar33 = iVar33 + -1;
    } while (pFVar13 != (FunctionJITTimeInfo *)0x0);
    if (0xfffffffc < -iVar33 - 5U) {
      *pIsInlined = true;
      pIVar20 = callInstr;
      do {
        do {
          pIVar20 = pIVar20->m_prev;
          OVar1 = pIVar20->m_opcode;
        } while (OVar1 == Ld_A);
      } while (OVar1 == ArgOut_A);
      if (OVar1 != StartCall) {
        bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,PolymorphicInlinePhase);
        if (bVar6) {
          pJVar14 = FunctionJITTimeInfo::GetBody(pFVar11);
          local_50 = (Instr *)JITTimeFunctionBody::GetDisplayName(pJVar14);
          pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar11,(wchar (*) [42])local_138);
          pLVar27 = local_40;
          pJVar14 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)local_40);
          pcVar17 = JITTimeFunctionBody::GetDisplayName(pJVar14);
          pcVar18 = FunctionJITTimeInfo::GetDebugNumberSet
                              ((FunctionJITTimeInfo *)pLVar27,(wchar (*) [42])local_198);
          form = 
          L"INLINING (Polymorphic; Using Fixed Methods): Skip Inline: ArgOuts may have side effects Inlinee: %s (%s):\tCaller: %s (%s)\n"
          ;
          pIVar20 = local_50;
          goto LAB_005407de;
        }
        goto LAB_005407ed;
      }
      local_88 = (AddrOpnd *)CONCAT44(local_88._4_4_,-iVar33);
      pOVar25 = callInstr->m_src1;
      local_68 = symCallerThis;
      OVar7 = IR::Opnd::GetKind(pOVar25);
      if (OVar7 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar6) goto LAB_005412d5;
        *puVar12 = 0;
      }
      pp_Var3 = pOVar25[1]._vptr_Opnd;
      if (*(char *)((long)pp_Var3 + 0x14) != '\x01') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar6) goto LAB_005412d5;
        *puVar12 = 0;
      }
      pIVar20 = (Instr *)pp_Var3[5];
      if ((*(byte *)(pp_Var3 + 3) & pIVar20 != (Instr *)0x0) == 0) {
        pIVar20 = InlinePolymorphicFunction
                            (local_48,callInstr,(FunctionJITTimeInfo *)local_40,local_68,
                             (ProfileId)local_58,pIsInlined,recursiveInlineDepth,true);
        return pIVar20;
      }
      OVar7 = IR::Opnd::GetKind(pIVar20->m_src1);
      symCallerThis = local_68;
      if (OVar7 == OpndKindSym) {
        this_00 = (SymOpnd *)pIVar20->m_src1;
        local_a0 = pIVar20;
        OVar7 = IR::Opnd::GetKind((Opnd *)this_00);
        if (OVar7 != OpndKindSym) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar12 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
          if (!bVar6) goto LAB_005412d5;
          *puVar12 = 0;
          symCallerThis = local_68;
        }
        bVar6 = IR::SymOpnd::IsPropertySymOpnd(this_00);
        if (!bVar6) goto LAB_00540765;
        pPVar19 = IR::Opnd::AsPropertySymOpnd(local_a0->m_src1);
        if (pPVar19->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) {
          bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,PolymorphicInlinePhase);
          if (!bVar6) goto LAB_005407ed;
          pJVar14 = FunctionJITTimeInfo::GetBody(pFVar11);
          pIVar20 = (Instr *)JITTimeFunctionBody::GetDisplayName(pJVar14);
          pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar11,(wchar (*) [42])local_138);
          pLVar27 = local_40;
          pJVar14 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)local_40);
          pcVar17 = JITTimeFunctionBody::GetDisplayName(pJVar14);
          pcVar18 = FunctionJITTimeInfo::GetDebugNumberSet
                              ((FunctionJITTimeInfo *)pLVar27,(wchar (*) [42])local_198);
          form = 
          L"INLINING (Polymorphic; Using Fixed Methods): Skip Inline: no ObjTypeSpecFldInfo to get Fixed Methods from Inlinee: %s (%s):\tCaller: %s (%s)\n"
          ;
          symCallerThis = local_68;
          goto LAB_005407de;
        }
        bVar6 = ObjTypeSpecFldInfo::HasFixedValue(pPVar19->objTypeSpecFldInfo);
        if (!bVar6) {
          bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,PolymorphicInlinePhase);
          if (bVar6) {
            pJVar14 = FunctionJITTimeInfo::GetBody(pFVar11);
            pIVar20 = (Instr *)JITTimeFunctionBody::GetDisplayName(pJVar14);
            pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar11,(wchar (*) [42])local_138);
            pLVar27 = local_40;
            pJVar14 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)local_40);
            pcVar17 = JITTimeFunctionBody::GetDisplayName(pJVar14);
            pcVar18 = FunctionJITTimeInfo::GetDebugNumberSet
                                ((FunctionJITTimeInfo *)pLVar27,(wchar (*) [42])local_198);
            form = 
            L"INLINING (Polymorphic; Using Fixed Methods): Skip Inline: ObjTypeSpecFldInfo doesn\'t have Fixed Methods for one or some of the inlinees Inlinee: %s (%s):\tCaller: %s (%s)\n"
            ;
            symCallerThis = local_68;
            goto LAB_005407de;
          }
          goto LAB_005407ed;
        }
        cachedFixedInlineeCount = IR::PropertySymOpnd::GetFixedFieldCount(pPVar19);
        if (1 < cachedFixedInlineeCount) {
          local_80 = (FunctionJITTimeInfo *)CONCAT62(local_80._2_6_,cachedFixedInlineeCount);
          local_70 = pPVar19;
          local_90 = IR::PropertySymOpnd::GetFixedFieldInfoArray(pPVar19);
          uVar9 = HandleDifferentTypesSameFunction
                            ((Inline *)pPVar19,local_90,cachedFixedInlineeCount);
          if (iVar33 + uVar9 == 0) {
            local_5c = (uint)cachedFixedInlineeCount;
            if ((ushort)local_80 < 5) {
              this_01 = &PTR_01548f08;
              local_80 = (FunctionJITTimeInfo *)__tls_get_addr();
            }
            else {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              pFVar13 = (FunctionJITTimeInfo *)__tls_get_addr(&PTR_01548f08);
              (pFVar13->m_data).isAggressiveInliningEnabled = '\x01';
              (pFVar13->m_data).isInlined = '\0';
              (pFVar13->m_data).struct_pad_0 = 0;
              pcVar32 = 
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
              ;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                 ,0x359,
                                 "(cachedFixedInlineeCount <= Js::DynamicProfileInfo::maxPolymorphicInliningSize)"
                                 ,
                                 "cachedFixedInlineeCount <= Js::DynamicProfileInfo::maxPolymorphicInliningSize"
                                );
              if (!bVar6) {
LAB_005412d5:
                pcVar5 = (code *)invalidInstructionException();
                (*pcVar5)();
              }
              (pFVar13->m_data).isAggressiveInliningEnabled = '\0';
              (pFVar13->m_data).isInlined = '\0';
              (pFVar13->m_data).struct_pad_0 = 0;
              this_01 = (undefined **)pcVar32;
              local_80 = pFVar13;
            }
            inlineesDataArray[1] = (FunctionJITTimeInfo *)0x0;
            inlineesDataArray[2] = (FunctionJITTimeInfo *)0x0;
            pFStack_d8 = (FunctionJITTimeInfo *)0x0;
            inlineesDataArray[0] = (FunctionJITTimeInfo *)0x0;
            FillInlineesDataArrayUsingFixedMethods
                      ((Inline *)this_01,pFVar11,&pFStack_d8,4,local_90,(uint16)local_5c);
            uVar34 = 0;
            do {
              pFVar13 = inlineesDataArray[uVar34 - 1];
              if ((pFVar13 == (FunctionJITTimeInfo *)0x0) ||
                 (bVar6 = FunctionJITTimeInfo::HasBody(pFVar13), !bVar6)) {
                bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,PolymorphicInlinePhase);
                pLVar27 = local_40;
                if (!bVar6) goto LAB_00540eb8;
                pJVar14 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)local_40);
                pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar14);
                pcVar17 = FunctionJITTimeInfo::GetDebugNumberSet
                                    ((FunctionJITTimeInfo *)pLVar27,(wchar (*) [42])local_138);
                Output::Print(L"INLINING (Polymorphic; Using Fixed Methods): Skip Inline: One of the inlinees doesn\'t have the corresponding object/prototype\'s type cached\tCaller: %s (%s)\n"
                              ,pcVar15,pcVar17);
                goto LAB_00540eb3;
              }
              pJVar14 = FunctionJITTimeInfo::GetBody(pFVar13);
              pFVar22 = local_90;
              if (pJVar14 != (JITTimeFunctionBody *)0x0) {
                iVar21 = FunctionJITTimeInfo::GetFunctionInfoAddr(pFVar13);
                pFVar22 = IR::PropertySymOpnd::GetFixedFunction(local_70,(uint)uVar34);
                iVar23 = FixedFieldInfo::GetFuncInfoAddr(pFVar22);
                pFVar22 = local_90;
                if (iVar21 != iVar23) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  pFVar13 = local_80;
                  (pFVar13->m_data).isAggressiveInliningEnabled = '\x01';
                  (pFVar13->m_data).isInlined = '\0';
                  (pFVar13->m_data).struct_pad_0 = 0;
                  bVar6 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                     ,0x369,"(false)",
                                     "inlineesDataArray and fixedfunctionInfoArray should be aligned with each other at this point"
                                    );
                  if (!bVar6) goto LAB_005412d5;
                  (pFVar13->m_data).isAggressiveInliningEnabled = '\0';
                  (pFVar13->m_data).isInlined = '\0';
                  (pFVar13->m_data).struct_pad_0 = 0;
                  pFVar22 = local_90;
                }
              }
              do {
                bVar6 = FixedFieldInfo::NextHasSameFixedField(pFVar22 + uVar34);
                uVar35 = (int)uVar34 + 1;
                uVar34 = (ulong)uVar35;
              } while (bVar6);
            } while (uVar35 < local_5c);
            local_31[0] = true;
            uVar35 = 0;
            local_98 = (RegOpnd *)pFStack_d8;
            pIVar16 = local_48;
LAB_00540b74:
            iVar21 = IR::PropertySymOpnd::GetFieldValue(local_70,uVar35);
            pPVar19 = local_70;
            if (iVar21 == 0) {
              bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,PolymorphicInlinePhase);
              if (!bVar6) goto LAB_00540eb8;
              pFVar11 = inlineesDataArray[(ulong)uVar35 - 1];
              pJVar14 = FunctionJITTimeInfo::GetBody(pFVar11);
              pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar14);
              pcVar17 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar11,(wchar (*) [42])local_138);
              pLVar27 = local_40;
              pJVar14 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)local_40);
              pcVar18 = JITTimeFunctionBody::GetDisplayName(pJVar14);
              pcVar26 = FunctionJITTimeInfo::GetDebugNumberSet
                                  ((FunctionJITTimeInfo *)pLVar27,(wchar (*) [42])local_198);
              Output::Print(L"INLINING (Polymorphic; Using Fixed Methods): Skip Inline: no fixed method for one of the inlinees; Inlinee: %s (%s):\tCaller: %s (%s)\n"
                            ,pcVar15,pcVar17,pcVar18,pcVar26);
              goto LAB_00540eb3;
            }
            if (uVar35 != 0) {
              pFVar22 = IR::PropertySymOpnd::GetFixedFunction(local_70,uVar35);
              if (pFVar22 != (FixedFieldInfo *)0x0) {
                pFVar22 = IR::PropertySymOpnd::GetFixedFunction(pPVar19,uVar35);
                iVar21 = FixedFieldInfo::GetFuncInfoAddr(pFVar22);
                iVar23 = FunctionJITTimeInfo::GetFunctionInfoAddr
                                   (inlineesDataArray[(ulong)uVar35 - 1]);
                pIVar16 = local_48;
                if (iVar21 != iVar23) goto LAB_00540f60;
              }
LAB_00540c14:
              TVar10 = IR::PropertySymOpnd::GetTypeId(pPVar19,uVar35);
              pFVar22 = local_90;
              if (0x3a < TVar10 - TypeIds_HostDispatch) {
                local_31[0] = false;
              }
              do {
                bVar6 = FixedFieldInfo::NextHasSameFixedField(pFVar22 + uVar35);
                uVar35 = uVar35 + 1;
              } while (bVar6);
              if (local_5c <= uVar35) goto code_r0x00540c56;
              goto LAB_00540b74;
            }
            bVar6 = TryOptimizeCallInstrWithFixedMethod
                              (pIVar16,callInstr,(FunctionJITTimeInfo *)local_98,true,false,false,
                               true,local_31,true,0);
            pPVar19 = local_70;
            if (bVar6) goto LAB_00540c14;
LAB_00540f60:
            bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,PolymorphicInlinePhase);
            if (!bVar6) goto LAB_00540eb8;
            pJVar14 = FunctionJITTimeInfo::GetBody(pFVar11);
            pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar14);
            pcVar17 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar11,(wchar (*) [42])local_138);
            pLVar27 = local_40;
            pJVar14 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)local_40);
            pcVar18 = JITTimeFunctionBody::GetDisplayName(pJVar14);
            pcVar26 = FunctionJITTimeInfo::GetDebugNumberSet
                                ((FunctionJITTimeInfo *)pLVar27,(wchar (*) [42])local_198);
            Output::Print(L"INLINING (Polymorphic; Using Fixed Methods): Skip Inline: can\'t optimize using Fixed Methods %d (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"
                          ,(ulong)local_88 & 0xffffffff,4,pcVar15,pcVar17,pcVar18,pcVar26);
LAB_00540eb3:
            Output::Flush();
LAB_00540eb8:
            symCallerThis = local_68;
            goto LAB_00540800;
          }
          local_50 = (Instr *)CONCAT44(local_50._4_4_,uVar9);
          bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,PolymorphicInlinePhase);
          if (bVar6) {
            pJVar14 = FunctionJITTimeInfo::GetBody(pFVar11);
            local_a0 = (Instr *)JITTimeFunctionBody::GetDisplayName(pJVar14);
            pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar11,(wchar (*) [42])local_138);
            pLVar27 = local_40;
            pJVar14 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)local_40);
            pcVar17 = JITTimeFunctionBody::GetDisplayName(pJVar14);
            pcVar18 = FunctionJITTimeInfo::GetDebugNumberSet
                                ((FunctionJITTimeInfo *)pLVar27,(wchar (*) [42])local_198);
            Output::Print(L"INLINING (Polymorphic; Using Fixed Methods): Skip Inline: cached fixed function count (%d) doesn\'t match inlinee count (%d); (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"
                          ,(ulong)local_50 & 0xffffffff,(ulong)local_88 & 0xffffffff,4,local_a0,
                          pcVar15,pcVar17,pcVar18);
            goto LAB_005407e8;
          }
          goto LAB_005407ed;
        }
        bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,PolymorphicInlinePhase);
        if (!bVar6) goto LAB_005407ed;
        pJVar14 = FunctionJITTimeInfo::GetBody(pFVar11);
        local_50 = (Instr *)JITTimeFunctionBody::GetDisplayName(pJVar14);
        pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar11,(wchar (*) [42])local_138);
        pLVar27 = local_40;
        pJVar14 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)local_40);
        pcVar17 = JITTimeFunctionBody::GetDisplayName(pJVar14);
        pcVar18 = FunctionJITTimeInfo::GetDebugNumberSet
                            ((FunctionJITTimeInfo *)pLVar27,(wchar (*) [42])local_198);
        symCallerThis = local_68;
        Output::Print(L"INLINING (Polymorphic; Using Fixed Methods): Skip Inline: fixed function count too less %d (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"
                      ,(ulong)cachedFixedInlineeCount,4,local_50,pcVar15,pcVar17,pcVar18);
LAB_005407e8:
        Output::Flush();
      }
      else {
LAB_00540765:
        bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,PolymorphicInlinePhase);
        if (bVar6) {
          pJVar14 = FunctionJITTimeInfo::GetBody(pFVar11);
          pIVar20 = (Instr *)JITTimeFunctionBody::GetDisplayName(pJVar14);
          pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar11,(wchar (*) [42])local_138);
          pLVar27 = local_40;
          pJVar14 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)local_40);
          pcVar17 = JITTimeFunctionBody::GetDisplayName(pJVar14);
          pcVar18 = FunctionJITTimeInfo::GetDebugNumberSet
                              ((FunctionJITTimeInfo *)pLVar27,(wchar (*) [42])local_198);
          form = 
          L"INLINING (Polymorphic; Using Fixed Methods): Skip Inline: Did not find property sym operand for the method load Inlinee: %s (%s):\tCaller: %s (%s)\n"
          ;
          symCallerThis = local_68;
LAB_005407de:
          Output::Print(form,pIVar20,pcVar15,pcVar17,pcVar18);
          goto LAB_005407e8;
        }
      }
LAB_005407ed:
LAB_00540800:
      pIVar20 = InlinePolymorphicFunction
                          (local_48,callInstr,(FunctionJITTimeInfo *)local_40,symCallerThis,
                           (ProfileId)local_58,pIsInlined,recursiveInlineDepth,true);
      return pIVar20;
    }
    bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,PolymorphicInlinePhase);
    if (!bVar6) goto LAB_005403e4;
    pJVar14 = FunctionJITTimeInfo::GetBody(pFVar11);
    local_48 = (Inline *)JITTimeFunctionBody::GetDisplayName(pJVar14);
    pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar11,(wchar (*) [42])local_138);
    pLVar27 = local_40;
    pJVar14 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)local_40);
    pcVar17 = JITTimeFunctionBody::GetDisplayName(pJVar14);
    pcVar18 = FunctionJITTimeInfo::GetDebugNumberSet
                        ((FunctionJITTimeInfo *)pLVar27,(wchar (*) [42])local_198);
    Output::Print(L"INLINING (Polymorphic): Skip Inline: Inlinee count either too small or too large: InlineeCount %d (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"
                  ,(ulong)(uint)-iVar33,4,local_48,pcVar15,pcVar17,pcVar18);
  }
LAB_005403df:
  Output::Flush();
LAB_005403e4:
  if (methodValueOpnd != (PropertySymOpnd *)0x0) {
    bVar6 = IR::PropertySymOpnd::ShouldResetObjTypeSpecFldInfo(methodValueOpnd);
    if (bVar6) {
      methodValueOpnd->objTypeSpecFldInfo = (ObjTypeSpecFldInfo *)0x0;
      methodValueOpnd->field_0x61 = methodValueOpnd->field_0x61 & 0xfe;
      methodValueOpnd->slotIndex = 0;
    }
    if ((methodValueOpnd->m_runtimePolymorphicInlineCache != (JITTimePolymorphicInlineCache *)0x0)
       && (-1 < (char)methodValueOpnd->m_polyCacheUtil)) {
      methodValueOpnd->m_runtimePolymorphicInlineCache = (JITTimePolymorphicInlineCache *)0x0;
    }
  }
  return local_50;
code_r0x00540c56:
  if ((local_70->objTypeSpecFldInfo != (ObjTypeSpecFldInfo *)0x0) &&
     (bVar6 = ObjTypeSpecFldInfo::IsPoly(local_70->objTypeSpecFldInfo), bVar6)) {
LAB_00540cb3:
    local_58 = IR::RegOpnd::New(TyVar,callInstr->m_func);
    pIVar20 = local_a0;
    local_78 = callInstr;
    pIVar24 = IR::Instr::New(CheckPropertyGuardAndLoadType,&local_58->super_Opnd,local_a0->m_src1,
                             callInstr->m_func);
    IR::Instr::InsertBefore(pIVar20,pIVar24);
    IR::Instr::SetByteCodeOffset(pIVar24,pIVar20);
    IR::Instr::ConvertToBailOutInstr(pIVar24,pIVar20,BailOutFailedFixedFieldCheck,0xffffffff);
    bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,PolymorphicInlinePhase);
    if (bVar6) {
      Output::Print(L"------------------------------------------------\n");
      Output::Flush();
    }
    uVar34 = 0;
    do {
      pFVar11 = inlineesDataArray[uVar34 - 1];
      pJVar14 = FunctionJITTimeInfo::GetBody(pFVar11);
      bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,PolymorphicInlinePhase);
      pFVar22 = local_90;
      if (bVar6) {
        local_88 = (AddrOpnd *)JITTimeFunctionBody::GetDisplayName(pJVar14);
        pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar11,(wchar (*) [42])local_138);
        pLVar27 = local_40;
        pJVar14 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)local_40);
        JITTimeFunctionBody::GetDisplayName(pJVar14);
        FunctionJITTimeInfo::GetDebugNumberSet
                  ((FunctionJITTimeInfo *)pLVar27,(wchar (*) [42])local_198);
        Output::Print(L"INLINING (Polymorphic; Using Fixed Methods): Start inlining: \tInlinee: %s (%s):\tCaller: %s (%s)\n"
                      ,local_88,pcVar15);
        Output::Flush();
        pFVar22 = local_90;
      }
      do {
        bVar6 = FixedFieldInfo::NextHasSameFixedField(pFVar22 + uVar34);
        uVar35 = (int)uVar34 + 1;
        uVar34 = (ulong)uVar35;
      } while (bVar6);
    } while (uVar35 < local_5c);
    bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,PolymorphicInlinePhase);
    if (bVar6) {
      Output::Print(L"------------------------------------------------\n");
      Output::Flush();
    }
    uVar34 = 0;
    if (local_78->m_dst == (Opnd *)0x0) {
      local_98 = (RegOpnd *)0x0;
    }
    else {
      pOVar25 = IR::Instr::UnlinkDst(local_78);
      local_98 = IR::Opnd::AsRegOpnd(pOVar25);
    }
    pIVar20 = local_78;
    IR::Instr::MoveArgs(local_78,true);
    pIVar20->m_opcode = CallIFixed;
    pLVar27 = IR::LabelInstr::New(Label,pIVar20->m_func,false);
    instr = IR::LabelInstr::New(Label,pIVar20->m_func,false);
    IR::Instr::InsertBefore(pIVar20,&instr->super_Instr);
    inlineesDataArray[3] = (FunctionJITTimeInfo *)(ulong)(local_31[0] & 1);
    pPVar19 = local_70;
    do {
      pIVar20 = local_78;
      local_40 = IR::LabelInstr::New(Label,local_78->m_func,false);
      IR::Instr::InsertBefore(pIVar20,&local_40->super_Instr);
      uVar9 = (uint)uVar34;
      iVar21 = IR::PropertySymOpnd::GetFieldValue(pPVar19,uVar9);
      local_88 = IR::AddrOpnd::New(iVar21,AddrOpndKindDynamicVar,pIVar20->m_func,false,(Var)0x0);
      local_88->field_0x28 = local_88->field_0x28 | 2;
      pFVar22 = IR::PropertySymOpnd::GetFixedFieldInfoArray(pPVar19);
      pAVar29 = local_88;
      local_88->m_metadata = pFVar22 + uVar34;
      local_80 = inlineesDataArray[uVar34 - 1];
      inlineeRuntimeData = FunctionJITTimeInfo::GetRuntimeInfo(local_80);
      InsertOneInlinee(local_48,pIVar20,local_98,&pAVar29->super_Opnd,local_80,inlineeRuntimeData,
                       pLVar27,local_68,SUB81(inlineesDataArray[3],0),recursiveInlineDepth);
      bVar6 = FixedFieldInfo::NextHasSameFixedField(local_90 + uVar34);
      pPVar19 = local_70;
      pFVar22 = local_90;
      src1Opnd = local_58;
      if (bVar6) {
        do {
          uVar9 = (uint)uVar34;
          local_a8.t = (Type)IR::PropertySymOpnd::GetType(pPVar19,uVar9);
          pJVar28 = JITTypeHolderBase<void>::operator->(&local_a8);
          iVar21 = JITType::GetAddr(pJVar28);
          pAVar29 = IR::AddrOpnd::New(iVar21,AddrOpndKindDynamicType,(instr->super_Instr).m_func,
                                      false,(Var)0x0);
          pBVar30 = IR::BranchInstr::New
                              (BrAddr_A,local_40,&src1Opnd->super_Opnd,&pAVar29->super_Opnd,
                               (instr->super_Instr).m_func);
          IR::Instr::InsertBefore(&instr->super_Instr,&pBVar30->super_Instr);
          pFVar4 = local_48->topFunc;
          JVar31 = IR::PropertySymOpnd::GetType(pPVar19,uVar9);
          src1Opnd = local_58;
          Func::PinTypeRef(pFVar4,JVar31.t);
          uVar9 = uVar9 + 1;
          uVar34 = (ulong)uVar9;
          bVar6 = FixedFieldInfo::NextHasSameFixedField(pFVar22 + uVar34);
        } while (bVar6);
      }
      local_a8.t = (Type)IR::PropertySymOpnd::GetType(pPVar19,uVar9);
      pJVar28 = JITTypeHolderBase<void>::operator->(&local_a8);
      iVar21 = JITType::GetAddr(pJVar28);
      pAVar29 = IR::AddrOpnd::New(iVar21,AddrOpndKindDynamicType,(instr->super_Instr).m_func,false,
                                  (Var)0x0);
      pBVar30 = IR::BranchInstr::New
                          (BrAddr_A,local_40,&src1Opnd->super_Opnd,&pAVar29->super_Opnd,
                           (instr->super_Instr).m_func);
      IR::Instr::InsertBefore(&instr->super_Instr,&pBVar30->super_Instr);
      pFVar4 = local_48->topFunc;
      JVar31 = IR::PropertySymOpnd::GetType(pPVar19,uVar9);
      Func::PinTypeRef(pFVar4,JVar31.t);
      pIVar20 = local_a0;
      uVar34 = (ulong)(uVar9 + 1);
    } while (uVar9 + 1 < local_5c);
    pIVar24 = local_a0;
    IR::Instr::Unlink(local_a0);
    pIVar20->m_opcode = LdMethodFldPolyInlineMiss;
    CompletePolymorphicInlining
              ((Inline *)pIVar24,local_78,local_98,pLVar27,&instr->super_Instr,pIVar20,
               BailOutOnFailedPolymorphicInlineTypeCheck);
    pIVar16 = local_48;
    Func::SetHasInlinee(local_48->topFunc);
    pIVar24 = local_50;
    InsertStatementBoundary(pIVar16,local_50);
    InsertStatementBoundary(pIVar16,pIVar20);
    return pIVar24;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  pFVar11 = local_80;
  (pFVar11->m_data).isAggressiveInliningEnabled = '\x01';
  (pFVar11->m_data).isInlined = '\0';
  (pFVar11->m_data).struct_pad_0 = 0;
  bVar6 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                     ,0x3a0,"(methodPropertyOpnd->IsPoly())","methodPropertyOpnd->IsPoly()");
  if (bVar6) {
    (pFVar11->m_data).isAggressiveInliningEnabled = '\0';
    (pFVar11->m_data).isInlined = '\0';
    (pFVar11->m_data).struct_pad_0 = 0;
    goto LAB_00540cb3;
  }
  goto LAB_005412d5;
}

Assistant:

IR::Instr *
Inline::InlinePolymorphicFunctionUsingFixedMethods(IR::Instr *callInstr, const FunctionJITTimeInfo * inlinerData, const StackSym *symCallerThis, const Js::ProfileId profileId, IR::PropertySymOpnd* methodValueOpnd, bool* pIsInlined, uint recursiveInlineDepth)
{
    IR::Instr* instrNext = callInstr->m_next;
    *pIsInlined = false;

    const FunctionJITTimeInfo* inlineeJitTimeData = inlinerData->GetInlinee(profileId);
    AnalysisAssert(inlineeJitTimeData);

#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif

    // Abort conditions:
    if(!inlineeJitTimeData->GetNext())
    {
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic): Skip Inline: Missing JitTime data \tInlinee: %s (%s):\tCaller: %s (%s)\n"),
                 inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                 inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));

        // There are no multiple codegen jit-time data allocated for this call site, not sure how is this possible, abort
        TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
        TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
        return instrNext;
    }

    // arguments exceed MaxInlineeArgoutCount
    if (callInstr->GetSrc2() &&
        callInstr->GetSrc2()->IsSymOpnd() &&
        callInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum() > Js::InlineeCallInfo::MaxInlineeArgoutCount)
    {
        // This is a hard limit as we only use 4 bits to encode the actual count in the InlineeCallInfo. Although
        // InliningDecider already checks for this, the check is against profile data that may not be accurate since profile
        // data matching does not take into account some types of changes to source code. Need to check this again with current
        // information.
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic): Skip Inline: ArgSlot > MaxInlineeArgoutCount\tInlinee: %s (%s)\tArgSlotNum: %d\tMaxInlineeArgoutCount: %d\tCaller: %s (%s)\n"),
            inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer) , callInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum(),
            Js::InlineeCallInfo::MaxInlineeArgoutCount, inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));

        TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
        TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
        return instrNext;
    }

    uint inlineeCount = 0;
    const FunctionJITTimeInfo * tmpInlineeJitTimeData = inlineeJitTimeData;
    while(tmpInlineeJitTimeData)
    {
        inlineeCount++;
        tmpInlineeJitTimeData = tmpInlineeJitTimeData->GetNext();
    }

    // Inlinee count too small (<2) or too large (>4)
    if (inlineeCount < 2 || inlineeCount > Js::DynamicProfileInfo::maxPolymorphicInliningSize)
    {
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic): Skip Inline: Inlinee count either too small or too large: InlineeCount %d (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineeCount, Js::DynamicProfileInfo::maxPolymorphicInliningSize,
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));

        TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
        TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
        return instrNext;
    }

    *pIsInlined = true;

    IR::Instr* tmpInstr = callInstr->m_prev;
    while (tmpInstr->m_opcode != Js::OpCode::StartCall)
    {
        if ((tmpInstr->m_opcode != Js::OpCode::ArgOut_A) && (tmpInstr->m_opcode != Js::OpCode::Ld_A))
        {
            POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: ArgOuts may have side effects Inlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
            return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
        }
        tmpInstr = tmpInstr->m_prev;
    }

    StackSym* methodValueSym = callInstr->GetSrc1()->AsRegOpnd()->m_sym->AsStackSym();
    if (!methodValueSym->IsSingleDef())
    {
        return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
    }

    IR::Instr* ldMethodFldInstr = methodValueSym->GetInstrDef();
    if (!(ldMethodFldInstr->GetSrc1()->IsSymOpnd() && ldMethodFldInstr->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd()))
    {
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: Did not find property sym operand for the method load Inlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
        return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
    }

    IR::PropertySymOpnd* methodPropertyOpnd = ldMethodFldInstr->GetSrc1()->AsPropertySymOpnd();
    if (!methodPropertyOpnd->HasObjTypeSpecFldInfo())
    {
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: no ObjTypeSpecFldInfo to get Fixed Methods from Inlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
        return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
    }

    if (!methodPropertyOpnd->HasFixedValue())
    {
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: ObjTypeSpecFldInfo doesn't have Fixed Methods for one or some of the inlinees Inlinee: %s (%s):\tCaller: %s (%s)\n"),

                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
        return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
    }

    uint16 cachedFixedInlineeCount = methodPropertyOpnd->GetFixedFieldCount();
    if (cachedFixedInlineeCount < 2)
    {
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: fixed function count too less %d (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"),
                    cachedFixedInlineeCount, Js::DynamicProfileInfo::maxPolymorphicInliningSize,
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
        return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
    }

    FixedFieldInfo* fixedFunctionInfoArray = methodPropertyOpnd->GetFixedFieldInfoArray();

    // It might so be the case that two objects of different types call the same function (body), for e.g., if they share the prototype on which the function is defined.
    uint uniqueFixedFunctionCount = HandleDifferentTypesSameFunction(fixedFunctionInfoArray, cachedFixedInlineeCount);

    if (uniqueFixedFunctionCount != inlineeCount)
    {
        // inlineeCount obtained from the inlineeJitTimeData is more accurate than cached number of fixed methods for inlinees.
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: cached fixed function count (%d) doesn't match inlinee count (%d); (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"),
                    uniqueFixedFunctionCount, inlineeCount, Js::DynamicProfileInfo::maxPolymorphicInliningSize,
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
        return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
    }

    Assert(cachedFixedInlineeCount <= Js::DynamicProfileInfo::maxPolymorphicInliningSize);
    const FunctionJITTimeInfo* inlineesDataArray[Js::DynamicProfileInfo::maxPolymorphicInliningSize] = {};

    FillInlineesDataArrayUsingFixedMethods(inlineeJitTimeData, inlineesDataArray, Js::DynamicProfileInfo::maxPolymorphicInliningSize, fixedFunctionInfoArray, cachedFixedInlineeCount);

    for (uint i = 0; i < cachedFixedInlineeCount; i++)
    {
        if(!inlineesDataArray[i] || !inlineesDataArray[i]->HasBody())
        {
            POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: One of the inlinees doesn't have the corresponding object/prototype's type cached\tCaller: %s (%s)\n"),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
            return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
        }
#if DBG
        if(inlineesDataArray[i]->GetBody() && inlineesDataArray[i]->GetFunctionInfoAddr() != methodPropertyOpnd->GetFixedFunction(i)->GetFuncInfoAddr())
        {
            AssertMsg(false, "inlineesDataArray and fixedfunctionInfoArray should be aligned with each other at this point");
        }
#endif
        while (fixedFunctionInfoArray[i].NextHasSameFixedField())
        {
            i++;
        }
    }

    bool safeThis = true; // Eliminate CheckThis for inlining.
    for (uint i = 0; i < cachedFixedInlineeCount; i++)
    {
        if (!methodPropertyOpnd->GetFieldValue(i))
        {
            POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: no fixed method for one of the inlinees; Inlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineesDataArray[i]->GetBody()->GetDisplayName(), inlineesDataArray[i]->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
            return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
        }
        if (i == 0)
        {
            // Do all the general, non-function-object-specific checks just once.
            if (!TryOptimizeCallInstrWithFixedMethod(callInstr, inlineesDataArray[i], true, false, false, true /*isInlined*/, safeThis, true /*dontOptimizeJustCheck*/, i))
            {
                POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: can't optimize using Fixed Methods %d (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineeCount, Js::DynamicProfileInfo::maxPolymorphicInliningSize,
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
                return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
            }
        }
        else
        {
            if (methodPropertyOpnd->GetFixedFunction(i) &&
                methodPropertyOpnd->GetFixedFunction(i)->GetFuncInfoAddr() != inlineesDataArray[i]->GetFunctionInfoAddr())
            {
                POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: can't optimize using Fixed Methods %d (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineeCount, Js::DynamicProfileInfo::maxPolymorphicInliningSize,
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
                return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth,  true);
            }
        }
        Js::TypeId typeId = methodPropertyOpnd->GetTypeId(i);
        if(!(typeId > Js::TypeIds_LastJavascriptPrimitiveType && typeId <= Js::TypeIds_LastTrueJavascriptObjectType))
        {
            // Don't eliminate CheckThis if it cannot be done for any one of the inlinees
            safeThis = false;
        }
        while (fixedFunctionInfoArray[i].NextHasSameFixedField())
        {
            i++;
        }
    }

    Assert(methodPropertyOpnd->IsPoly());

    // emit property guard check for the method load, and load type
    IR::RegOpnd *typeOpnd = IR::RegOpnd::New(TyVar, callInstr->m_func);
    IR::Instr* propertyGuardCheckInstr = IR::Instr::New(Js::OpCode::CheckPropertyGuardAndLoadType, typeOpnd, ldMethodFldInstr->GetSrc1(), callInstr->m_func);
    ldMethodFldInstr->InsertBefore(propertyGuardCheckInstr);
    propertyGuardCheckInstr->SetByteCodeOffset(ldMethodFldInstr);
    propertyGuardCheckInstr = propertyGuardCheckInstr->ConvertToBailOutInstr(ldMethodFldInstr, IR::BailOutFailedFixedFieldCheck);

    POLYMORPHIC_INLINE_TESTTRACE(_u("------------------------------------------------\n"));
    for (uint i = 0; i < cachedFixedInlineeCount; i++)
    {
        JITTimeFunctionBody *inlineeFunctionBody = inlineesDataArray[i]->GetBody();
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Start inlining: \tInlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineeFunctionBody->GetDisplayName(), inlineesDataArray[i]->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));

        while (fixedFunctionInfoArray[i].NextHasSameFixedField())
        {
            i++;
        }
    }
    POLYMORPHIC_INLINE_TESTTRACE(_u("------------------------------------------------\n"));

    IR::RegOpnd * returnValueOpnd;
    if (callInstr->GetDst())
    {
        returnValueOpnd = callInstr->UnlinkDst()->AsRegOpnd();
    }
    else
    {
        returnValueOpnd = nullptr;
    }

    callInstr->MoveArgs(/*generateByteCodeCapture*/ true);

    callInstr->m_opcode = Js::OpCode::CallIFixed;

    // iterate over inlineesDataArray to emit each inlinee
    IR::LabelInstr * doneLabel = IR::LabelInstr::New(Js::OpCode::Label, callInstr->m_func, false);
    IR::Instr* dispatchStartLabel = IR::LabelInstr::New(Js::OpCode::Label, callInstr->m_func, false);
    callInstr->InsertBefore(dispatchStartLabel);
    for(uint i=0; i < cachedFixedInlineeCount; i++)
    {
        IR::LabelInstr* inlineeStartLabel = IR::LabelInstr::New(Js::OpCode::Label, callInstr->m_func);
        callInstr->InsertBefore(inlineeStartLabel);

        IR::AddrOpnd * constMethodValueOpnd = IR::AddrOpnd::New(methodPropertyOpnd->GetFieldValue(i), IR::AddrOpndKind::AddrOpndKindDynamicVar, callInstr->m_func);
        constMethodValueOpnd->m_isFunction = true;
        constMethodValueOpnd->m_metadata = &methodPropertyOpnd->GetFixedFieldInfoArray()[i];

        InsertOneInlinee(callInstr, returnValueOpnd, constMethodValueOpnd, inlineesDataArray[i], inlineesDataArray[i]->GetRuntimeInfo(), doneLabel, symCallerThis, safeThis, recursiveInlineDepth);
        while (fixedFunctionInfoArray[i].NextHasSameFixedField())
        {
            dispatchStartLabel->InsertBefore(IR::BranchInstr::New(Js::OpCode::BrAddr_A, inlineeStartLabel, typeOpnd, IR::AddrOpnd::New(methodPropertyOpnd->GetType(i)->GetAddr(),
                IR::AddrOpndKindDynamicType, dispatchStartLabel->m_func), dispatchStartLabel->m_func));
            this->topFunc->PinTypeRef(methodPropertyOpnd->GetType(i).t); // Keep the types alive as the types may not be equivalent and, hence, won't be kept alive by EquivalentTypeCache
            i++;
        }

        dispatchStartLabel->InsertBefore(IR::BranchInstr::New(Js::OpCode::BrAddr_A, inlineeStartLabel,
            typeOpnd, IR::AddrOpnd::New(methodPropertyOpnd->GetType(i)->GetAddr(), IR::AddrOpndKindDynamicType, dispatchStartLabel->m_func), dispatchStartLabel->m_func));
        this->topFunc->PinTypeRef(methodPropertyOpnd->GetType(i).t); // Keep the types alive as the types may not be equivalent and, hence, won't be kept alive by EquivalentTypeCache
    }

    ldMethodFldInstr->Unlink();
    ldMethodFldInstr->m_opcode = Js::OpCode::LdMethodFldPolyInlineMiss;
    Assert(cachedFixedInlineeCount > 0);
    CompletePolymorphicInlining(callInstr, returnValueOpnd, doneLabel, dispatchStartLabel, ldMethodFldInstr, IR::BailOutOnFailedPolymorphicInlineTypeCheck);

    this->topFunc->SetHasInlinee();
    InsertStatementBoundary(instrNext);
    InsertStatementBoundary(ldMethodFldInstr);

    return instrNext;
}